

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O0

void NotifyOfDocumentsClosedElsewhere(ExampleAppDocuments *app)

{
  MyDocument *pMVar1;
  ImVector<MyDocument> *in_RDI;
  MyDocument *doc;
  int doc_n;
  int local_c;
  
  for (local_c = 0; local_c < in_RDI->Size; local_c = local_c + 1) {
    pMVar1 = ImVector<MyDocument>::operator[](in_RDI,local_c);
    if (((pMVar1->Open & 1U) == 0) && ((pMVar1->OpenPrev & 1U) != 0)) {
      ImGui::SetTabItemClosed((char *)app);
    }
    pMVar1->OpenPrev = (bool)(pMVar1->Open & 1);
  }
  return;
}

Assistant:

static void NotifyOfDocumentsClosedElsewhere(ExampleAppDocuments& app)
{
    for (int doc_n = 0; doc_n < app.Documents.Size; doc_n++)
    {
        MyDocument* doc = &app.Documents[doc_n];
        if (!doc->Open && doc->OpenPrev)
            ImGui::SetTabItemClosed(doc->Name);
        doc->OpenPrev = doc->Open;
    }
}